

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  int y;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint _c;
  uint _w;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  void *pvVar13;
  Mat top_blob_c;
  
  _w = this->output_width;
  uVar6 = this->output_height;
  if (bottom_blob->dims == 1) {
    uVar8 = 1;
    uVar1 = 1;
    _c = bottom_blob->w;
  }
  else {
    uVar8 = bottom_blob->h;
    _c = bottom_blob->c;
    uVar1 = bottom_blob->w;
  }
  if (_w == 0 || uVar6 == 0) {
    uVar6 = (uint)((float)(int)uVar8 * this->height_scale);
    _w = (uint)((float)(int)uVar1 * this->width_scale);
  }
  uVar5 = (ulong)uVar6;
  if ((uVar6 == uVar8) && (_w == uVar1)) {
    Mat::operator=(top_blob,bottom_blob);
  }
  else {
    Mat::create(top_blob,_w,uVar6,_c,4);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (bottom_blob->dims == 1) {
      uVar5 = (ulong)_c;
      if ((int)_c < 1) {
        uVar5 = 0;
      }
      for (uVar12 = 0; uVar5 != uVar12; uVar12 = uVar12 + 1) {
        Mat::channel(&top_blob_c,top_blob,(int)uVar12);
        Mat::fill(&top_blob_c,*(float *)((long)bottom_blob->data + uVar12 * 4));
        Mat::~Mat(&top_blob_c);
      }
    }
    else {
      uVar2 = this->resize_type;
      if (uVar2 == 2) {
        resize_bilinear(bottom_blob,top_blob,_w,uVar6);
      }
      else {
        if (uVar2 != 1) {
          fprintf(_stderr,"unsupported resize type %d %d %d\n",(ulong)uVar2,uVar5,(ulong)_w);
          return -0xe9;
        }
        uVar12 = 0;
        if (0 < (int)_w) {
          uVar12 = (ulong)_w;
        }
        if ((int)uVar6 < 1) {
          uVar5 = 0;
        }
        if ((int)_c < 1) {
          _c = 0;
        }
        for (uVar6 = 0; uVar6 != _c; uVar6 = uVar6 + 1) {
          Mat::channel(&top_blob_c,bottom_blob,uVar6);
          pvVar3 = top_blob_c.data;
          Mat::~Mat(&top_blob_c);
          Mat::channel(&top_blob_c,top_blob,uVar6);
          pvVar13 = top_blob_c.data;
          Mat::~Mat(&top_blob_c);
          for (uVar4 = 0; uVar4 != uVar5; uVar4 = uVar4 + 1) {
            iVar11 = (int)((float)(int)uVar4 / this->height_scale);
            if ((int)(uVar8 - 1) < iVar11) {
              iVar11 = uVar8 - 1;
            }
            for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
              iVar10 = (int)((float)(int)uVar7 / this->width_scale);
              iVar9 = uVar1 - 1;
              if (iVar10 <= (int)(uVar1 - 1)) {
                iVar9 = iVar10;
              }
              *(undefined4 *)((long)pvVar13 + uVar7 * 4) =
                   *(undefined4 *)((long)pvVar3 + (long)(int)(iVar9 + iVar11 * uVar1) * 4);
            }
            pvVar13 = (void *)((long)pvVar13 + (long)(int)_w * 4);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob) const
{
    int h = bottom_blob.h;
    int w = bottom_blob.w;
    int c = bottom_blob.c;
    int oh = output_height;
    int ow = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        c = bottom_blob.w;
    }
    if (oh == 0 || ow == 0)
    {
        oh = h * height_scale;
        ow = w * width_scale;
    }
    if (oh == h && ow == w)
    {
        top_blob = bottom_blob;
        return 0;
    }
    top_blob.create(ow, oh, c);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for
        for (int q = 0; q < c; ++q)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)//nearest
    {
        #pragma omp parallel for
        for (int q = 0; q < c; ++q)
        {
            const float *ptr = bottom_blob.channel(q);
            float *output_ptr = top_blob.channel(q);
            for (int y = 0; y < oh; ++y)
            {
                const int in_y = std::min((int) (y / height_scale), (h - 1));
                for (int x = 0; x < ow; ++x)
                {
                    const int in_x = std::min((int) (x / width_scale), (w - 1));
                    output_ptr[ow * y + x] = ptr[in_y * w + in_x];
                }
            }
        }
        return 0;

    }
    else if (resize_type == 2)// bilinear
    {
        resize_bilinear(bottom_blob, top_blob, ow, oh);
        return 0;

    }
    else
    {
        fprintf(stderr, "unsupported resize type %d %d %d\n", resize_type, oh, ow);
        return -233;
    }
}